

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QXmlStreamNamespaceDeclaration>::moveAppend
          (QGenericArrayOps<QXmlStreamNamespaceDeclaration> *this,QXmlStreamNamespaceDeclaration *b,
          QXmlStreamNamespaceDeclaration *e)

{
  qsizetype *pqVar1;
  QXmlStreamNamespaceDeclaration *pQVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QXmlStreamNamespaceDeclaration>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QXmlStreamNamespaceDeclaration>).size;
      pDVar4 = (b->m_prefix).m_string.d;
      (b->m_prefix).m_string.d = (Data *)0x0;
      pQVar2[lVar3].m_prefix.m_string.d = pDVar4;
      pcVar5 = (b->m_prefix).m_string.ptr;
      (b->m_prefix).m_string.ptr = (char16_t *)0x0;
      pQVar2[lVar3].m_prefix.m_string.ptr = pcVar5;
      qVar6 = (b->m_prefix).m_string.size;
      (b->m_prefix).m_string.size = 0;
      pQVar2[lVar3].m_prefix.m_string.size = qVar6;
      pDVar4 = (b->m_namespaceUri).m_string.d;
      (b->m_namespaceUri).m_string.d = (Data *)0x0;
      pQVar2[lVar3].m_namespaceUri.m_string.d = pDVar4;
      pcVar5 = (b->m_namespaceUri).m_string.ptr;
      (b->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
      pQVar2[lVar3].m_namespaceUri.m_string.ptr = pcVar5;
      qVar6 = (b->m_namespaceUri).m_string.size;
      (b->m_namespaceUri).m_string.size = 0;
      pQVar2[lVar3].m_namespaceUri.m_string.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QXmlStreamNamespaceDeclaration>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }